

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::BindingModel::anon_unknown_1::SingleTargetRenderInstance::createFramebuffer
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vki,
          VkDevice device,VkRenderPass renderpass,VkImageView colorAttachmentView,UVec2 *size)

{
  undefined1 local_78 [8];
  VkFramebufferCreateInfo framebufferCreateInfo;
  UVec2 *size_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkImageView colorAttachmentView_local;
  VkRenderPass renderpass_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.pNext._0_4_ = 0;
  framebufferCreateInfo.renderPass.m_internal._0_4_ = 1;
  framebufferCreateInfo._32_8_ = &vki_local;
  framebufferCreateInfo._16_8_ = renderpass.m_internal;
  framebufferCreateInfo._56_8_ = size;
  vki_local = (DeviceInterface *)colorAttachmentView.m_internal;
  colorAttachmentView_local.m_internal = renderpass.m_internal;
  framebufferCreateInfo.pAttachments._0_4_ = tcu::Vector<unsigned_int,_2>::x(size);
  framebufferCreateInfo.pAttachments._4_4_ =
       tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)framebufferCreateInfo._56_8_);
  framebufferCreateInfo.width = 1;
  ::vk::createFramebuffer
            (__return_storage_ptr__,vki,device,(VkFramebufferCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkFramebuffer> SingleTargetRenderInstance::createFramebuffer (const vk::DeviceInterface&	vki,
																		   vk::VkDevice					device,
																		   vk::VkRenderPass				renderpass,
																		   vk::VkImageView				colorAttachmentView,
																		   const tcu::UVec2&			size)
{
	const vk::VkFramebufferCreateInfo	framebufferCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,
		DE_NULL,
		(vk::VkFramebufferCreateFlags)0,
		renderpass,				// renderPass
		1u,						// attachmentCount
		&colorAttachmentView,	// pAttachments
		size.x(),				// width
		size.y(),				// height
		1,						// layers
	};

	return vk::createFramebuffer(vki, device, &framebufferCreateInfo);
}